

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * kwssys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  char buf [2048];
  char acStack_818 [2048];
  
  __s = getcwd(acStack_818,0x800);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)in_RDI,0,(char *)0x0,(ulong)__s);
    ConvertToUnixSlashes(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::GetCurrentWorkingDirectory()
{
  char buf[2048];
  const char* cwd = Getcwd(buf, 2048);
  std::string path;
  if (cwd) {
    path = cwd;
    SystemTools::ConvertToUnixSlashes(path);
  }
  return path;
}